

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

int Saig_ManDemiter(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  uint *__ptr;
  void *pvVar4;
  void *__ptr_00;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  Aig_Man_t *pAVar13;
  uint uVar14;
  uint *puVar15;
  ulong uVar16;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *local_90;
  Aig_Obj_t *local_88;
  uint *local_80;
  uint *local_78;
  Aig_Man_t *local_70;
  uint *local_68;
  uint *local_60;
  uint *local_58;
  Aig_Man_t **local_50;
  Aig_Man_t **local_48;
  long local_40;
  ulong local_38;
  
  local_50 = ppAig1;
  local_48 = ppAig0;
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                  ,0x38c,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
  }
  Aig_ManSetCioIds(p);
  iVar2 = p->nTruePos;
  local_70 = p;
  __ptr = (uint *)malloc(0x10);
  uVar3 = 8;
  if (6 < iVar2 * 2 - 1U) {
    uVar3 = iVar2 * 2;
  }
  __ptr[1] = 0;
  *__ptr = uVar3;
  if (uVar3 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar3 << 3);
  }
  *(void **)(__ptr + 2) = pvVar4;
  uVar3 = local_70->nTruePos;
  if (0 < (int)uVar3) {
    lVar12 = 0;
    do {
      if (local_70->vCos->nSize <= lVar12) goto LAB_0065c05d;
      iVar2 = Aig_ObjRecognizeExor
                        ((Aig_Obj_t *)
                         (*(ulong *)((long)local_70->vCos->pArray[lVar12] + 8) & 0xfffffffffffffffe)
                         ,&local_88,&local_90);
      pAVar5 = local_88;
      if (iVar2 == 0) {
        pvVar4 = *(void **)(__ptr + 2);
        iVar2 = 0;
        goto LAB_0065c031;
      }
      uVar3 = __ptr[1];
      uVar10 = *__ptr;
      if (uVar3 == uVar10) {
        if ((int)uVar10 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar14 = 0x10;
        }
        else {
          uVar14 = uVar10 * 2;
          if ((int)uVar14 <= (int)uVar10) goto LAB_0065b904;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar4 = malloc((ulong)uVar10 << 4);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar10 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar4;
        *__ptr = uVar14;
      }
LAB_0065b904:
      pAVar6 = local_90;
      pvVar4 = *(void **)(__ptr + 2);
      __ptr[1] = uVar3 + 1;
      *(Aig_Obj_t **)((long)pvVar4 + (long)(int)uVar3 * 8) = pAVar5;
      uVar10 = *__ptr;
      if (uVar3 + 1 == uVar10) {
        if ((int)uVar10 < 0x10) {
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(pvVar4,0x80);
          }
          uVar14 = 0x10;
        }
        else {
          uVar14 = uVar10 * 2;
          if ((int)uVar14 <= (int)uVar10) goto LAB_0065b971;
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc((ulong)uVar10 << 4);
          }
          else {
            pvVar4 = realloc(pvVar4,(ulong)uVar10 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar4;
        *__ptr = uVar14;
      }
LAB_0065b971:
      __ptr[1] = uVar3 + 2;
      *(Aig_Obj_t **)(*(long *)(__ptr + 2) + 8 + (long)(int)uVar3 * 8) = pAVar6;
      lVar12 = lVar12 + 1;
      uVar3 = local_70->nTruePos;
    } while (lVar12 < (int)uVar3);
  }
  local_78 = (uint *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar3 - 1) {
    uVar10 = uVar3;
  }
  local_78[1] = 0;
  *local_78 = uVar10;
  if (uVar10 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar10 * 8);
  }
  *(void **)(local_78 + 2) = pvVar4;
  local_80 = (uint *)malloc(0x10);
  local_80[1] = 0;
  *local_80 = uVar10;
  if (uVar10 == 0) {
    __ptr_00 = (void *)0x0;
  }
  else {
    __ptr_00 = malloc((long)(int)uVar10 << 3);
  }
  pAVar13 = local_70;
  *(void **)(local_80 + 2) = __ptr_00;
  if (0 < (int)__ptr[1]) {
    local_88 = (Aig_Obj_t *)**(ulong **)(__ptr + 2);
    local_58 = __ptr;
    if (__ptr[1] != 1) {
      puVar7 = local_78 + 1;
      puVar9 = local_78 + 2;
      local_90 = (Aig_Obj_t *)(*(ulong **)(__ptr + 2))[1];
      Aig_ManIncrementTravId(local_70);
      Saig_ManDemiterLabel_rec(pAVar13,(Aig_Obj_t *)((ulong)local_88 & 0xfffffffffffffffe),0);
      pAVar5 = local_88;
      local_60 = puVar7;
      if (uVar10 == 0) {
        if (pvVar4 == (void *)0x0) {
          pvVar4 = malloc(0x80);
        }
        else {
          pvVar4 = realloc(pvVar4,0x80);
        }
        *(void **)(local_78 + 2) = pvVar4;
        *local_78 = 0x10;
        pAVar13 = local_70;
      }
      puVar7 = local_80 + 1;
      puVar15 = local_80 + 2;
      puVar1 = *(ulong **)puVar9;
      *local_60 = 1;
      *puVar1 = (ulong)pAVar5;
      Aig_ManIncrementTravId(pAVar13);
      Saig_ManDemiterLabel_rec(pAVar13,(Aig_Obj_t *)((ulong)local_90 & 0xfffffffffffffffe),1);
      __ptr = local_58;
      pAVar5 = local_90;
      local_68 = puVar7;
      if (uVar10 == 0) {
        if (__ptr_00 == (void *)0x0) {
          pvVar4 = malloc(0x80);
        }
        else {
          pvVar4 = realloc(__ptr_00,0x80);
        }
        *(void **)(local_80 + 2) = pvVar4;
        *local_80 = 0x10;
      }
      puVar1 = *(ulong **)puVar15;
      *local_68 = 1;
      *puVar1 = (ulong)pAVar5;
      if (2 < (long)(int)__ptr[1]) {
        local_40 = *(long *)(__ptr + 2);
        uVar16 = 1;
        uVar11 = 3;
        local_38 = (long)(int)__ptr[1];
        do {
          pAVar13 = local_70;
          local_88 = *(Aig_Obj_t **)(local_40 + -8 + uVar11 * 8);
          if (local_38 <= uVar11) goto LAB_0065c05d;
          local_90 = *(Aig_Obj_t **)(local_40 + uVar11 * 8);
          Aig_ManIncrementTravId(local_70);
          pAVar5 = Saig_ManGetLabeledRegister_rec
                             (pAVar13,(Aig_Obj_t *)((ulong)local_88 & 0xfffffffffffffffe));
          Aig_ManIncrementTravId(pAVar13);
          pAVar6 = Saig_ManGetLabeledRegister_rec
                             (pAVar13,(Aig_Obj_t *)((ulong)local_90 & 0xfffffffffffffffe));
          uVar3 = (uint)*(undefined8 *)&pAVar5->field_0x18;
          if ((((~uVar3 & 0x30) == 0) || ((~*(uint *)&pAVar6->field_0x18 & 0x30) == 0)) ||
             ((uVar3 & *(uint *)&pAVar6->field_0x18 & 0x30) != 0)) {
            printf("Ouput pair %4d: Difficult case...\n",uVar16);
          }
          if ((pAVar5->field_0x18 & 0x20) == 0) {
            Saig_ManDemiterLabel_rec(pAVar13,local_88,0);
            pAVar5 = local_88;
            uVar3 = *local_80;
            uVar10 = local_80[1];
            puVar7 = puVar15;
            puVar8 = local_68;
            if (uVar10 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (*(void **)puVar15 == (void *)0x0) {
                  pvVar4 = malloc(0x80);
                }
                else {
                  pvVar4 = realloc(*(void **)puVar15,0x80);
                }
                uVar14 = 0x10;
              }
              else {
                uVar14 = uVar3 * 2;
                if ((int)uVar14 <= (int)uVar3) goto LAB_0065bd9e;
                if (*(void **)puVar15 == (void *)0x0) {
                  pvVar4 = malloc((ulong)uVar3 << 4);
                }
                else {
                  pvVar4 = realloc(*(void **)puVar15,(ulong)uVar3 << 4);
                }
              }
              *(void **)(local_80 + 2) = pvVar4;
              *local_80 = uVar14;
              puVar8 = local_68;
            }
          }
          else {
            Saig_ManDemiterLabel_rec(pAVar13,local_88,1);
            pAVar5 = local_88;
            uVar3 = *local_78;
            uVar10 = local_78[1];
            puVar7 = puVar9;
            puVar8 = local_60;
            if (uVar10 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (*(void **)puVar9 == (void *)0x0) {
                  pvVar4 = malloc(0x80);
                }
                else {
                  pvVar4 = realloc(*(void **)puVar9,0x80);
                }
                uVar14 = 0x10;
              }
              else {
                uVar14 = uVar3 * 2;
                if ((int)uVar14 <= (int)uVar3) goto LAB_0065bd9e;
                if (*(void **)puVar9 == (void *)0x0) {
                  pvVar4 = malloc((ulong)uVar3 << 4);
                }
                else {
                  pvVar4 = realloc(*(void **)puVar9,(ulong)uVar3 << 4);
                }
              }
              *(void **)(local_78 + 2) = pvVar4;
              *local_78 = uVar14;
              puVar8 = local_60;
            }
          }
LAB_0065bd9e:
          __ptr = local_58;
          lVar12 = *(long *)puVar7;
          *puVar8 = uVar10 + 1;
          *(Aig_Obj_t **)(lVar12 + (long)(int)uVar10 * 8) = pAVar5;
          if ((pAVar6->field_0x18 & 0x20) == 0) {
            Saig_ManDemiterLabel_rec(local_70,local_90,0);
            pAVar5 = local_90;
            uVar3 = *local_80;
            uVar10 = local_80[1];
            puVar7 = puVar15;
            puVar8 = local_68;
            if (uVar10 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (*(void **)puVar15 == (void *)0x0) {
                  pvVar4 = malloc(0x80);
                }
                else {
                  pvVar4 = realloc(*(void **)puVar15,0x80);
                }
                uVar14 = 0x10;
              }
              else {
                uVar14 = uVar3 * 2;
                if ((int)uVar14 <= (int)uVar3) goto LAB_0065bf07;
                if (*(void **)puVar15 == (void *)0x0) {
                  pvVar4 = malloc((ulong)uVar3 << 4);
                }
                else {
                  pvVar4 = realloc(*(void **)puVar15,(ulong)uVar3 << 4);
                }
              }
              *(void **)(local_80 + 2) = pvVar4;
              *local_80 = uVar14;
              puVar8 = local_68;
            }
          }
          else {
            Saig_ManDemiterLabel_rec(local_70,local_90,1);
            pAVar5 = local_90;
            uVar3 = *local_78;
            uVar10 = local_78[1];
            puVar7 = puVar9;
            puVar8 = local_60;
            if (uVar10 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (*(void **)puVar9 == (void *)0x0) {
                  pvVar4 = malloc(0x80);
                }
                else {
                  pvVar4 = realloc(*(void **)puVar9,0x80);
                }
                uVar14 = 0x10;
              }
              else {
                uVar14 = uVar3 * 2;
                if ((int)uVar14 <= (int)uVar3) goto LAB_0065bf07;
                if (*(void **)puVar9 == (void *)0x0) {
                  pvVar4 = malloc((ulong)uVar3 << 4);
                }
                else {
                  pvVar4 = realloc(*(void **)puVar9,(ulong)uVar3 << 4);
                }
              }
              *(void **)(local_78 + 2) = pvVar4;
              *local_78 = uVar14;
              puVar8 = local_60;
            }
          }
LAB_0065bf07:
          lVar12 = *(long *)puVar7;
          *puVar8 = uVar10 + 1;
          *(Aig_Obj_t **)(lVar12 + (long)(int)uVar10 * 8) = pAVar5;
          uVar16 = (ulong)((int)uVar16 + 1);
          iVar2 = (int)uVar11;
          uVar11 = uVar11 + 2;
        } while (iVar2 + 1 < (int)local_38);
      }
      lVar12 = (long)local_70->nRegs;
      if (lVar12 < 1) {
        iVar2 = 0;
      }
      else {
        uVar11 = (ulong)(uint)local_70->nTruePis;
        iVar2 = 0;
        do {
          if ((local_70->nTruePis < 0) || (local_70->vCis->nSize <= (int)uVar11)) goto LAB_0065c05d;
          iVar2 = iVar2 + (uint)((~*(uint *)((long)local_70->vCis->pArray[uVar11] + 0x18) & 0x30) ==
                                0);
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      if (0 < iVar2) {
        printf("The miters contains %d flops reachable from both AIGs.\n");
      }
      if (local_48 != (Aig_Man_t **)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                      ,0x3d8,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
      }
      if (local_50 != (Aig_Man_t **)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                      ,0x3df,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
      }
      if (*(void **)puVar9 != (void *)0x0) {
        free(*(void **)puVar9);
        puVar9[0] = 0;
        puVar9[1] = 0;
      }
      free(local_78);
      if (*(void **)puVar15 != (void *)0x0) {
        free(*(void **)puVar15);
        puVar15[0] = 0;
        puVar15[1] = 0;
      }
      free(local_80);
      pvVar4 = *(void **)(__ptr + 2);
      iVar2 = 1;
LAB_0065c031:
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      return iVar2;
    }
  }
LAB_0065c05d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManDemiter( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vPairs, * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pObj0, * pObj1, * pFlop0, * pFlop1;
    int i, Counter;
    assert( Saig_ManRegNum(p) > 0 );
    Aig_ManSetCioIds( p );
    // check if demitering is possible
    vPairs = Vec_PtrAlloc( 2 * Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( !Aig_ObjRecognizeExor( Aig_ObjFanin0(pObj), &pObj0, &pObj1 ) )
        {
            Vec_PtrFree( vPairs );
            return 0;
        }
        Vec_PtrPush( vPairs, pObj0 );
        Vec_PtrPush( vPairs, pObj1 );
    }
    // start array of outputs
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    // get the first pair of outputs
    pObj0 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, 0 );
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, 1 );
    // label registers reachable from the outputs
    Aig_ManIncrementTravId( p );
    Saig_ManDemiterLabel_rec( p, Aig_Regular(pObj0), 0 );
    Vec_PtrPush( vSet0, pObj0 );
    Aig_ManIncrementTravId( p );
    Saig_ManDemiterLabel_rec( p, Aig_Regular(pObj1), 1 );
    Vec_PtrPush( vSet1, pObj1 );
    // find where each output belongs
    for ( i = 2; i < Vec_PtrSize(vPairs); i += 2 )
    {
        pObj0 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, i   );
        pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, i+1 );

        Aig_ManIncrementTravId( p );
        pFlop0 = Saig_ManGetLabeledRegister_rec( p, Aig_Regular(pObj0) );

        Aig_ManIncrementTravId( p );
        pFlop1 = Saig_ManGetLabeledRegister_rec( p, Aig_Regular(pObj1) );

        if ( (pFlop0->fMarkA && pFlop0->fMarkB) || (pFlop1->fMarkA && pFlop1->fMarkB) || 
             (pFlop0->fMarkA && pFlop1->fMarkA) || (pFlop0->fMarkB && pFlop1->fMarkB)  )
            printf( "Ouput pair %4d: Difficult case...\n", i/2 );

        if ( pFlop0->fMarkB )
        {
            Saig_ManDemiterLabel_rec( p, pObj0, 1 );
            Vec_PtrPush( vSet0, pObj0 );
        }
        else // if ( pFlop0->fMarkA ) or none
        {
            Saig_ManDemiterLabel_rec( p, pObj0, 0 );
            Vec_PtrPush( vSet1, pObj0 );
        }

        if ( pFlop1->fMarkB )
        {
            Saig_ManDemiterLabel_rec( p, pObj1, 1 );
            Vec_PtrPush( vSet0, pObj1 );
        }
        else // if ( pFlop1->fMarkA ) or none
        {
            Saig_ManDemiterLabel_rec( p, pObj1, 0 );
            Vec_PtrPush( vSet1, pObj1 );
        }
    }
    // check if there are any flops in common
    Counter = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( pObj->fMarkA && pObj->fMarkB )
            Counter++;
    if ( Counter > 0 )
        printf( "The miters contains %d flops reachable from both AIGs.\n", Counter );

    // produce two miters
    if ( ppAig0 )
    {
        assert( 0 );
        *ppAig0 = Aig_ManDupNodesHalf( p, vSet0, 0 ); // not ready
        ABC_FREE( (*ppAig0)->pName );
        (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    }
    if ( ppAig1 )
    {
        assert( 0 );
        *ppAig1 = Aig_ManDupNodesHalf( p, vSet1, 1 ); // not ready
        ABC_FREE( (*ppAig1)->pName );
        (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    }
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    Vec_PtrFree( vPairs );
    return 1;
}